

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyFileImpl::~QNetworkReplyFileImpl(QNetworkReplyFileImpl *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  QObject *obj;
  
  *(undefined ***)this = &PTR_metaObject_002ca638;
  lVar1 = *(long *)(this + 8);
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x238));
  if (bVar3) {
    lVar4 = QObject::thread();
    lVar5 = QThread::currentThread();
    lVar2 = *(long *)(lVar1 + 0x238);
    if (lVar4 == lVar5) {
      if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long **)(lVar1 + 0x240) != (long *)0x0)
         ) {
        (**(code **)(**(long **)(lVar1 + 0x240) + 0x20))();
      }
    }
    else {
      if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
        obj = (QObject *)0x0;
      }
      else {
        obj = *(QObject **)(lVar1 + 0x240);
      }
      QMetaObject::invokeMethod<>(obj,"deleteLater",QueuedConnection);
    }
  }
  QNetworkReply::~QNetworkReply((QNetworkReply *)this);
  return;
}

Assistant:

QNetworkReplyFileImpl::~QNetworkReplyFileImpl()
{
    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();
    if (d->realFile) {
        if (d->realFile->thread() == QThread::currentThread())
            delete d->realFile;
        else
            QMetaObject::invokeMethod(d->realFile, "deleteLater", Qt::QueuedConnection);
    }
}